

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_catalog.c
# Opt level: O0

HPDF_UINT HPDF_Catalog_GetViewerPreference(HPDF_Catalog catalog)

{
  HPDF_Dict dict;
  void *pvVar1;
  HPDF_Boolean obj;
  HPDF_UINT value;
  HPDF_Dict preferences;
  HPDF_Catalog catalog_local;
  
  obj._4_4_ = 0;
  dict = (HPDF_Dict)HPDF_Dict_GetItem(catalog,"ViewerPreferences",0x11);
  if (dict == (HPDF_Dict)0x0) {
    catalog_local._4_4_ = 0;
  }
  else {
    pvVar1 = HPDF_Dict_GetItem(dict,"HideToolbar",3);
    if (pvVar1 != (void *)0x0) {
      obj._4_4_ = (HPDF_UINT)(*(int *)((long)pvVar1 + 8) != 0);
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"HideMenubar",3);
    if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 8) != 0)) {
      obj._4_4_ = obj._4_4_ + 2;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"HideWindowUI",3);
    if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 8) != 0)) {
      obj._4_4_ = obj._4_4_ + 4;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"FitWindow",3);
    if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 8) != 0)) {
      obj._4_4_ = obj._4_4_ + 8;
    }
    pvVar1 = HPDF_Dict_GetItem(dict,"CenterWindow",3);
    if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 8) != 0)) {
      obj._4_4_ = obj._4_4_ + 0x10;
    }
    catalog_local._4_4_ = obj._4_4_;
  }
  return catalog_local._4_4_;
}

Assistant:

HPDF_UINT
HPDF_Catalog_GetViewerPreference  (HPDF_Catalog   catalog)
{
    HPDF_Dict preferences;
    HPDF_UINT value = 0;
    HPDF_Boolean obj;

    HPDF_PTRACE ((" HPDF_Catalog_GetViewerPreference\n"));

    preferences = (HPDF_Dict)HPDF_Dict_GetItem (catalog, "ViewerPreferences",
            HPDF_OCLASS_DICT);

    if (!preferences)
        return 0;

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideToolbar",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_TOOLBAR;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideMenubar",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_MENUBAR;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "HideWindowUI",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_HIDE_WINDOW_UI;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "FitWindow",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_FIT_WINDOW;
    }

    obj = (HPDF_Boolean)HPDF_Dict_GetItem (preferences, "CenterWindow",
            HPDF_OCLASS_BOOLEAN);
    if (obj) {
        if (obj->value)
            value += HPDF_CENTER_WINDOW;
    }

    return value;
}